

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDComponentId face_id,ON_SubDFaceParameter fp)

{
  bool bVar1;
  uint face_id_00;
  uint uVar2;
  ON_SubDComponentId local_40;
  anon_union_8_3_6bf0bb0e_for_m_p0 local_38;
  ON_2dPoint p;
  ON_SubDFaceCornerDex cdex;
  ON_SubDComponentParameter *this_local;
  ON_SubDComponentId face_id_local;
  
  this->m_cid = ON_SubDComponentId::Unset;
  this_local = (ON_SubDComponentParameter *)face_id;
  memset(&this->m_p0,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p0).v_active_e);
  memset(&this->m_p1,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p1).v_active_f);
  bVar1 = ON_SubDComponentId::IsFaceId((ON_SubDComponentId *)&this_local);
  if ((bVar1) && (bVar1 = Internal_Init(this,(ON_SubDComponentId)this_local), bVar1)) {
    p.y._4_4_ = ON_SubDFaceParameter::FaceCornerDex(&fp);
    bVar1 = ON_SubDFaceCornerDex::IsSet((ON_SubDFaceCornerDex *)((long)&p.y + 4));
    if (bVar1) {
      _local_38 = ON_SubDFaceParameter::FaceCornerParameters(&fp);
      bVar1 = ON_2dPoint::IsValid((ON_2dPoint *)&local_38.v_active_e);
      if (bVar1) {
        face_id_00 = ON_SubDComponentId::FaceId((ON_SubDComponentId *)&this_local);
        uVar2 = ON_SubDComponentId::ComponentDirection((ON_SubDComponentId *)&this_local);
        ON_SubDComponentId::ON_SubDComponentId(&local_40,face_id_00,(ulong)uVar2,p.y._4_4_);
        this->m_cid = local_40;
        this->m_p0 = local_38;
        (this->m_p1).f_corner_t = p.x;
      }
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(ON_SubDComponentId face_id, ON_SubDFaceParameter fp)
{
  if (face_id.IsFaceId() && Internal_Init(face_id))
  {
    const ON_SubDFaceCornerDex cdex = fp.FaceCornerDex();
    if (cdex.IsSet())
    {
      const ON_2dPoint p = fp.FaceCornerParameters();
      if (p.IsValid())
      {
        this->m_cid = ON_SubDComponentId(face_id.FaceId(), face_id.ComponentDirection(), cdex);
        this->m_p0.f_corner_s = p.x;
        this->m_p1.f_corner_t = p.y;
      }
    }
  }
}